

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathexec_run.c
# Opt level: O0

void pathexec_run(char *file,char **argv,char **envp)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  int local_30;
  int savederrno;
  uint split;
  char *path;
  char **envp_local;
  char **argv_local;
  char *file_local;
  
  uVar1 = str_chr(file,0x2f);
  if (file[uVar1] == '\0') {
    _savederrno = env_get("PATH");
    if (_savederrno == (char *)0x0) {
      _savederrno = "/bin:/usr/bin";
    }
    local_30 = 0;
    while( true ) {
      uVar1 = str_chr(_savederrno,0x3a);
      iVar2 = stralloc_copyb(&tmp,_savederrno,uVar1);
      if (iVar2 == 0) {
        return;
      }
      if ((uVar1 == 0) && (iVar2 = stralloc_cats(&tmp,"."), iVar2 == 0)) {
        return;
      }
      iVar2 = stralloc_cats(&tmp,"/");
      if (iVar2 == 0) {
        return;
      }
      iVar2 = stralloc_cats(&tmp,file);
      if (iVar2 == 0) {
        return;
      }
      iVar2 = stralloc_append(&tmp,"");
      if (iVar2 == 0) {
        return;
      }
      execve(tmp.s,argv,envp);
      piVar3 = __errno_location();
      if (*piVar3 != error_noent) {
        piVar3 = __errno_location();
        local_30 = *piVar3;
        piVar3 = __errno_location();
        if (((*piVar3 != error_acces) && (piVar3 = __errno_location(), *piVar3 != error_perm)) &&
           (piVar3 = __errno_location(), *piVar3 != error_isdir)) {
          return;
        }
      }
      if (_savederrno[uVar1] == '\0') break;
      _savederrno = _savederrno + (ulong)uVar1 + 1;
    }
    if (local_30 != 0) {
      piVar3 = __errno_location();
      *piVar3 = local_30;
    }
  }
  else {
    execve(file,argv,envp);
  }
  return;
}

Assistant:

void pathexec_run(const char *file,const char * const *argv,const char * const *envp)
{
  const char *path;
  unsigned int split;
  int savederrno;

  if (file[str_chr(file,'/')]) {
    execve(file,(char *const*)argv,(char *const*)envp);
    return;
  }

  path = env_get("PATH");
  if (!path) path = "/bin:/usr/bin";

  savederrno = 0;
  for (;;) {
    split = str_chr(path,':');
    if (!stralloc_copyb(&tmp,path,split)) return;
    if (!split)
      if (!stralloc_cats(&tmp,".")) return;
    if (!stralloc_cats(&tmp,"/"))  return;
    if (!stralloc_cats(&tmp,file)) return;
    if (!stralloc_0(&tmp)) return;

    execve(tmp.s,(char *const*)argv,(char*const*)envp);
    if (errno != error_noent) {
      savederrno = errno;
      if ((errno != error_acces) && (errno != error_perm) && (errno != error_isdir)) return;
    }

    if (!path[split]) {
      if (savederrno) errno = savederrno;
      return;
    }
    path += split;
    path += 1;
  }
}